

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  byte bVar1;
  uint32_t res;
  uint8_t *ptr;
  unsigned_long *out_local;
  char *p_local;
  
  AssertBytesAreReadable(p,10);
  bVar1 = *p;
  if ((bVar1 & 0x80) == 0) {
    *out = (ulong)(uint)bVar1;
    p_local = p + 1;
  }
  else {
    p_local = VarintParseSlow(p,(uint)bVar1,out);
  }
  return p_local;
}

Assistant:

[[nodiscard]] const char* VarintParse(const char* p, T* out) {
  AssertBytesAreReadable(p, 10);
#if defined(__aarch64__) && defined(ABSL_IS_LITTLE_ENDIAN) && !defined(_MSC_VER)
  // This optimization is not supported in big endian mode
  uint64_t first8;
  std::memcpy(&first8, p, sizeof(first8));
  if (ABSL_PREDICT_TRUE((first8 & 0x80) == 0)) {
    *out = static_cast<uint8_t>(first8);
    return p + 1;
  }
  if (ABSL_PREDICT_TRUE((first8 & 0x8000) == 0)) {
    uint64_t chunk1;
    uint64_t chunk2;
    // Extracting the two chunks this way gives a speedup for this path.
    chunk1 = Ubfx7(first8, 0);
    chunk2 = Ubfx7(first8, 8);
    *out = chunk1 | (chunk2 << 7);
    return p + 2;
  }
  return VarintParseSlowArm(p, out, first8);
#else   // __aarch64__
  auto ptr = reinterpret_cast<const uint8_t*>(p);
  uint32_t res = ptr[0];
  if ((res & 0x80) == 0) {
    *out = res;
    return p + 1;
  }
  return VarintParseSlow(p, res, out);
#endif  // __aarch64__
}